

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool google::protobuf::TextFormat::PrintUnknownFields
               (UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer local_a0;
  
  Printer::Printer(&local_a0);
  bVar1 = Printer::PrintUnknownFields(&local_a0,unknown_fields,output);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::~_Rb_tree(&local_a0.custom_message_printers_._M_t);
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::~_Rb_tree(&local_a0.custom_printers_._M_t);
  if (local_a0.default_field_value_printer_._M_t.
      super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )0x0) {
    (**(code **)(*(long *)local_a0.default_field_value_printer_._M_t.
                          super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                          .
                          super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                          ._M_head_impl + 8))();
  }
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, io::ZeroCopyOutputStream* output) {
  return Printer().PrintUnknownFields(unknown_fields, output);
}